

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

sqlid_t hiberlite::Database::allocId(shared_connection *c,string *table)

{
  int result;
  sqlite3_int64 sVar1;
  database_error *this;
  char *err_msg;
  shared_connection local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  err_msg = (char *)0x0;
  std::operator+(&local_30,"INSERT INTO ",table);
  std::operator+(&local_90,&local_30," (");
  std::operator+(&local_70,&local_90,"hiberlite_id");
  std::operator+(&query,&local_70,") VALUES (NULL);");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  result = sqlite3_exec(c->res->res->con,query._M_dataplus._M_p,(sqlite3_callback)0x0,(void *)0x0,
                        &err_msg);
  if (err_msg == (char *)0x0) {
    local_a0._vptr_shared_res = (_func_int **)&PTR__shared_res_0018e7d0;
    local_a0.res = c->res;
    if (local_a0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_a0.res)->refCount = (local_a0.res)->refCount + 1;
    }
    database_error::database_assert(result,&local_a0);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_a0);
    sVar1 = sqlite3_last_insert_rowid(c->res->res->con);
    std::__cxx11::string::~string((string *)&query);
    return sVar1;
  }
  this = (database_error *)__cxa_allocate_exception(0x10);
  database_error::database_error(this,err_msg);
  __cxa_throw(this,&database_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

sqlid_t Database::allocId(shared_connection c, std::string table)
{
	//THREAD critical call
	char* err_msg=NULL;
	std::string query="INSERT INTO "+table+" ("+HIBERLITE_PRIMARY_KEY_COLUMN+") VALUES (NULL);";
	HIBERLITE_HL_DBG_DO( std::cout << "exec: " << query << std::endl; )
	int rc=sqlite3_exec(c->getSQLite3Ptr(),query.c_str(),NULL, NULL, &err_msg );
	if(err_msg)
		throw database_error(err_msg);
	database_error::database_assert(rc, c);

	return sqlite3_last_insert_rowid(c->getSQLite3Ptr());
}